

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.hpp
# Opt level: O1

int __thiscall RingBuffer<short>::pull(RingBuffer<short> *this,short *data,uint size)

{
  uint uVar1;
  short *psVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  short *psVar6;
  short *psVar7;
  long lVar8;
  
  uVar4 = filled(this);
  uVar3 = size;
  if (uVar4 < size) {
    uVar3 = uVar4;
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar5 == 0) {
    if (uVar3 != 0) {
      psVar2 = this->_buffer;
      uVar1 = this->_size;
      psVar6 = this->_readPtr;
      if (uVar4 < size) {
        size = uVar4;
      }
      lVar8 = 0;
      do {
        psVar7 = psVar6;
        if (psVar2 + uVar1 <= psVar6) {
          psVar7 = psVar2;
        }
        psVar6 = psVar7 + 1;
        data[lVar8] = *psVar7;
        lVar8 = lVar8 + 1;
      } while (size != (uint)lVar8);
      this->_readPtr = psVar6;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return uVar3;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

int pull(T* data, unsigned int size)
    {
        size = (std::min)(size, filled());
        std::lock_guard<std::mutex> lock{_mutex};
        int len = size;
        while(size--) {
            if( _readPtr >= _buffer + _size )
                _readPtr = _buffer;
            *data++ = *_readPtr++;
        }
        return len;
    }